

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManGroupProve(Gia_Man_t *pInit,char *pCommLine,int nGroupSize,int fVerbose)

{
  undefined1 auVar1 [16];
  Vec_Ptr_t *pVVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  void *pvVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  void **ppvVar9;
  Gia_Man_t *pNew;
  Abc_Cex_t *pAVar10;
  Vec_Int_t *pVVar11;
  Vec_Ptr_t *pVVar12;
  uint uVar13;
  long lVar15;
  ulong uVar16;
  int i;
  ulong uVar17;
  Abc_Frame_t *pAVar18;
  int i_1;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  timespec ts;
  Vec_Ptr_t *vCexes;
  timespec local_a8;
  uint *local_98;
  Vec_Ptr_t *local_90;
  char *local_88;
  double local_80;
  long local_78;
  Abc_Frame_t *local_70;
  long local_68;
  long local_60;
  ulong local_58;
  Gia_Man_t *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  uint uVar14;
  
  local_88 = pCommLine;
  local_70 = Abc_FrameReadGlobalFrame();
  pGVar4 = Gia_ManDup(pInit);
  iVar19 = 3;
  iVar3 = clock_gettime(3,&local_a8);
  if (iVar3 < 0) {
    local_78 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
    local_78 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_a8.tv_sec * -1000000;
  }
  if (nGroupSize < 1) {
    __assert_fail("nGroupSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x734,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if (local_88 == (char *)0x0) {
    __assert_fail("pCommLine != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x735,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if (pGVar4->nConstrs != 0) {
    __assert_fail("p->nConstrs == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x736,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  pvVar5 = (void *)0x0;
  Abc_Print(iVar19,"RUNNING MultiProve: Group size = %d. Command line = \"%s\".\n",
            (ulong)(uint)nGroupSize,local_88);
  iVar3 = pGVar4->nRegs;
  pVVar7 = pGVar4->vCos;
  uVar21 = pVVar7->nSize - iVar3;
  local_98 = (uint *)malloc(0x10);
  uVar22 = uVar21 - 1;
  uVar13 = 0x10;
  if (0xe < uVar22) {
    uVar13 = uVar21;
  }
  *local_98 = uVar13;
  if (uVar13 != 0) {
    pvVar5 = malloc((long)(int)uVar13 << 2);
  }
  *(void **)(local_98 + 2) = pvVar5;
  local_98[1] = uVar21;
  auVar1 = _DAT_008403e0;
  if (0 < (int)uVar21) {
    lVar15 = (ulong)uVar21 - 1;
    auVar24._8_4_ = (int)lVar15;
    auVar24._0_8_ = lVar15;
    auVar24._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar6 = 0;
    auVar24 = auVar24 ^ _DAT_008403e0;
    auVar25 = _DAT_008403d0;
    do {
      auVar26 = auVar25 ^ auVar1;
      if ((bool)(~(auVar26._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar26._0_4_ ||
                  auVar24._4_4_ < auVar26._4_4_) & 1)) {
        *(int *)((long)pvVar5 + uVar6 * 4) = (int)uVar6;
      }
      if ((auVar26._12_4_ != auVar24._12_4_ || auVar26._8_4_ <= auVar24._8_4_) &&
          auVar26._12_4_ <= auVar24._12_4_) {
        *(int *)((long)pvVar5 + uVar6 * 4 + 4) = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar15 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 2;
      auVar25._8_8_ = lVar15 + 2;
    } while ((uVar21 + 1 & 0xfffffffe) != uVar6);
    uVar21 = pVVar7->nSize - iVar3;
    uVar22 = uVar21 - 1;
  }
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar13 = 0x10;
  if (0xe < uVar22) {
    uVar13 = uVar21;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar13;
  if (uVar13 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)(int)uVar13 << 2);
  }
  pVVar7->pArray = piVar8;
  local_90 = (Vec_Ptr_t *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar22) {
    uVar13 = uVar21;
  }
  local_90->nSize = 0;
  local_90->nCap = uVar13;
  uVar22 = 0;
  if (uVar13 == 0) {
    ppvVar9 = (void **)0x0;
  }
  else {
    ppvVar9 = (void **)malloc((long)(int)uVar13 << 3);
  }
  local_90->pArray = ppvVar9;
  uVar14 = (uint)(0 < (int)uVar21 % nGroupSize);
  uVar13 = uVar14 + (int)uVar21 / nGroupSize;
  if (uVar13 == 0 || SCARRY4(uVar14,(int)uVar21 / nGroupSize) != (int)uVar13 < 0) {
    dVar23 = 0.0;
  }
  else {
    local_48 = (ulong)(uint)nGroupSize;
    lVar15 = 0;
    uVar6 = 0;
    local_58 = (ulong)uVar13;
    local_50 = pGVar4;
    do {
      iVar3 = local_50->vCos->nSize - local_50->nRegs;
      local_40 = uVar6 + 1;
      iVar19 = (int)(uVar6 * local_48);
      uVar22 = iVar3 - iVar19;
      if ((int)local_40 * nGroupSize < iVar3) {
        uVar22 = nGroupSize;
      }
      pGVar4 = local_50;
      local_38 = lVar15;
      pNew = Gia_ManDupCones(local_50,(int *)(uVar6 * local_48 * 4 + *(long *)(local_98 + 2)),uVar22
                             ,0);
      Abc_Print((int)pGVar4,"GROUP %4d : %4d <= PoId < %4d : ",uVar6 & 0xffffffff,
                (ulong)(uint)((int)uVar6 * nGroupSize),(ulong)(iVar19 + uVar22));
      pAVar18 = local_70;
      Abc_FrameUpdateGia(local_70,pNew);
      iVar3 = clock_gettime(3,&local_a8);
      if (iVar3 < 0) {
        local_60 = 1;
      }
      else {
        lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
        local_60 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_a8.tv_sec * -1000000;
      }
      Cmd_CommandExecute(pAVar18,local_88);
      iVar3 = clock_gettime(3,&local_a8);
      if (iVar3 < 0) {
        local_68 = -1;
      }
      else {
        local_68 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
      if (nGroupSize == 1) {
        iVar3 = Abc_FrameReadProbStatus(pAVar18);
        Vec_IntPush(pVVar7,iVar3);
        pVVar12 = local_90;
        pAVar10 = Abc_FrameReadCex(pAVar18);
        uVar22 = pVVar12->nSize;
        if (uVar22 == pVVar12->nCap) {
          if ((int)uVar22 < 0x10) {
            if (pVVar12->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc(0x80);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar12->pArray,0x80);
            }
            pVVar12->pArray = ppvVar9;
            pVVar12->nCap = 0x10;
          }
          else {
            if (pVVar12->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)uVar22 << 4);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar12->pArray,(ulong)uVar22 << 4);
            }
            pVVar12->pArray = ppvVar9;
            pVVar12->nCap = uVar22 * 2;
          }
        }
        else {
          ppvVar9 = pVVar12->pArray;
        }
        iVar3 = pVVar12->nSize;
        pVVar12->nSize = iVar3 + 1;
        ppvVar9[iVar3] = pAVar10;
      }
      else {
        pVVar11 = Abc_FrameReadPoStatuses(pAVar18);
        pVVar12 = Abc_FrameReadCexVec(pAVar18);
        if (pVVar11 == (Vec_Int_t *)0x0) {
          __assert_fail("vStatusCur != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                        ,0x753,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
        }
        if (0 < (int)uVar22) {
          local_80 = (double)(ulong)uVar22;
          uVar6 = 0;
          do {
            if ((long)pVVar11->nSize <= (long)uVar6) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            Vec_IntPush(pVVar7,pVVar11->pArray[uVar6]);
            pVVar2 = local_90;
            if (pVVar12 == (Vec_Ptr_t *)0x0) {
              pvVar5 = (void *)0x0;
            }
            else {
              if ((long)pVVar12->nSize <= (long)uVar6) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar5 = pVVar12->pArray[uVar6];
            }
            uVar22 = local_90->nSize;
            if (uVar22 == local_90->nCap) {
              if ((int)uVar22 < 0x10) {
                if (local_90->pArray == (void **)0x0) {
                  ppvVar9 = (void **)malloc(0x80);
                }
                else {
                  ppvVar9 = (void **)realloc(local_90->pArray,0x80);
                }
                pVVar2->pArray = ppvVar9;
                pVVar2->nCap = 0x10;
              }
              else {
                if (local_90->pArray == (void **)0x0) {
                  ppvVar9 = (void **)malloc((ulong)uVar22 << 4);
                }
                else {
                  ppvVar9 = (void **)realloc(local_90->pArray,(ulong)uVar22 << 4);
                }
                pVVar2->pArray = ppvVar9;
                pVVar2->nCap = uVar22 * 2;
              }
            }
            else {
              ppvVar9 = local_90->pArray;
            }
            iVar3 = pVVar2->nSize;
            pVVar2->nSize = iVar3 + 1;
            ppvVar9[iVar3] = pvVar5;
            uVar6 = uVar6 + 1;
          } while (uVar6 < (ulong)local_80);
        }
      }
      lVar15 = local_38 + local_60 + local_68;
      uVar6 = local_40;
    } while (local_40 != local_58);
    uVar22 = local_90->nSize;
    uVar21 = local_50->vCos->nSize - local_50->nRegs;
    dVar23 = (double)lVar15;
    pGVar4 = local_50;
  }
  pVVar12 = local_90;
  if (uVar22 != uVar21) {
    __assert_fail("Vec_PtrSize(vCexes) == Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x75c,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if (pVVar7->nSize != uVar22) {
    __assert_fail("Vec_IntSize(vOutMap) == Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x75d,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  uVar6 = (ulong)uVar22;
  if ((int)uVar22 < 1) {
    iVar3 = 0;
  }
  else {
    uVar16 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + (uint)(local_90->pArray[uVar16] == (void *)0x0);
      uVar16 = uVar16 + 1;
    } while (uVar6 != uVar16);
  }
  local_80 = dVar23;
  if (iVar3 < (int)uVar22) {
    pAVar18 = local_70;
    Abc_FrameReplaceCexVec(local_70,&local_90);
    iVar3 = (int)pAVar18;
  }
  else {
    if (local_90->pArray != (void **)0x0) {
      free(local_90->pArray);
    }
    free(pVVar12);
    iVar3 = (int)pVVar12;
  }
  uVar13 = 0;
  Abc_Print(iVar3,"SUMMARY:  ");
  Abc_Print(iVar3,"Properties = %6d. ",(ulong)(uint)(pGVar4->vCos->nSize - pGVar4->nRegs));
  if ((int)uVar22 < 1) {
    Abc_Print(iVar3,"UNSAT = %6d. ",0);
    Abc_Print(iVar3,"SAT = %6d. ",0);
  }
  else {
    piVar8 = pVVar7->pArray;
    uVar16 = 0;
    uVar20 = 0;
    do {
      uVar20 = (ulong)((int)uVar20 + (uint)(piVar8[uVar16] == 1));
      uVar16 = uVar16 + 1;
    } while (uVar6 != uVar16);
    uVar17 = 0;
    Abc_Print(iVar3,"UNSAT = %6d. ",uVar20);
    uVar16 = 0;
    do {
      uVar16 = (ulong)((int)uVar16 + (uint)(piVar8[uVar17] == 0));
      uVar17 = uVar17 + 1;
    } while (uVar6 != uVar17);
    uVar20 = 0;
    Abc_Print(iVar3,"SAT = %6d. ",uVar16);
    uVar13 = 0;
    do {
      uVar13 = uVar13 + (piVar8[uVar20] == -1);
      uVar20 = uVar20 + 1;
    } while (uVar6 != uVar20);
  }
  Abc_Print(iVar3,"UNDEC = %6d. ",(ulong)uVar13);
  Abc_Print(iVar3,"\n");
  Abc_Print(iVar3,"%s =","Command time");
  Abc_Print(iVar3,"%9.2f sec\n",local_80 / 1000000.0);
  iVar19 = 3;
  iVar3 = clock_gettime(3,&local_a8);
  if (iVar3 < 0) {
    lVar15 = -1;
  }
  else {
    lVar15 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
  }
  lVar15 = lVar15 + local_78;
  Abc_Print(iVar19,"%s =","Total time  ");
  Abc_Print(iVar19,"%9.2f sec\n",(double)lVar15 / 1000000.0);
  if (*(void **)(local_98 + 2) != (void *)0x0) {
    free(*(void **)(local_98 + 2));
  }
  free(local_98);
  Gia_ManStop(pGVar4);
  return pVVar7;
}

Assistant:

Vec_Int_t * Gia_ManGroupProve( Gia_Man_t * pInit, char * pCommLine, int nGroupSize, int fVerbose )
{
    Abc_Frame_t * pAbc = Abc_FrameReadGlobalFrame();
    Gia_Man_t * p = Gia_ManDup( pInit );
    Gia_Man_t * pGroup;
    Vec_Int_t * vOuts;
    Vec_Int_t * vOutMap;
    Vec_Ptr_t * vCexes;
    int i, k, nGroupCur, nGroups;
    abctime clk, timeComm = 0;
    abctime timeStart = Abc_Clock();
    // pre-conditions
    assert( nGroupSize > 0 );
    assert( pCommLine != NULL );
    assert( p->nConstrs == 0 );
    Abc_Print( 1, "RUNNING MultiProve: Group size = %d. Command line = \"%s\".\n", nGroupSize, pCommLine );
    // create output map
    vOuts   = Vec_IntStartNatural( Gia_ManPoNum(p) );
    vOutMap = Vec_IntAlloc( Gia_ManPoNum(p) );
    vCexes  = Vec_PtrAlloc( Gia_ManPoNum(p) );
    nGroups = Gia_ManPoNum(p) / nGroupSize + (int)((Gia_ManPoNum(p) % nGroupSize) > 0);
    for ( i = 0; i < nGroups; i++ )
    {
        // derive the group
        nGroupCur = ((i + 1) * nGroupSize < Gia_ManPoNum(p)) ? nGroupSize : Gia_ManPoNum(p) - i * nGroupSize;
        pGroup = Gia_ManDupCones( p, Vec_IntArray(vOuts) + i * nGroupSize, nGroupCur, 0 );
        Abc_Print( 1, "GROUP %4d : %4d <= PoId < %4d : ", i, i * nGroupSize, i * nGroupSize + nGroupCur );
        // set the current GIA
        Abc_FrameUpdateGia( pAbc, pGroup );
        // solve the group
        clk = Abc_Clock();
        Cmd_CommandExecute( pAbc, pCommLine );
        timeComm += Abc_Clock() - clk;
        // get the solution status
        if ( nGroupSize == 1 )
        {
            Vec_IntPush( vOutMap, Abc_FrameReadProbStatus(pAbc) );
            Vec_PtrPush( vCexes, Abc_FrameReadCex(pAbc) );
        }
        else // if ( nGroupSize > 1 )  
        {
            Vec_Int_t * vStatusCur = Abc_FrameReadPoStatuses( pAbc );
            Vec_Ptr_t * vCexesCur = Abc_FrameReadCexVec( pAbc );
            assert( vStatusCur != NULL ); // only works for "bmc3" and "pdr"
//            assert( vCexesCur != NULL );
            for ( k = 0; k < nGroupCur; k++ )
            {
                Vec_IntPush( vOutMap, Vec_IntEntry(vStatusCur, k) );
                Vec_PtrPush( vCexes, vCexesCur ? Vec_PtrEntry(vCexesCur, k) : NULL );
            }
        }
    }
    assert( Vec_PtrSize(vCexes) == Gia_ManPoNum(p) );
    assert( Vec_IntSize(vOutMap) == Gia_ManPoNum(p) );
    // set CEXes
    if ( Vec_PtrCountZero(vCexes) < Vec_PtrSize(vCexes) )
        Abc_FrameReplaceCexVec( pAbc, &vCexes );
    else  // there is no CEXes
        Vec_PtrFree( vCexes );
    // report the result
    Abc_Print( 1, "SUMMARY:  " );
    Abc_Print( 1, "Properties = %6d. ", Gia_ManPoNum(p) );
    Abc_Print( 1, "UNSAT = %6d. ",      Vec_IntCountEntry(vOutMap, 1) );
    Abc_Print( 1, "SAT = %6d. ",        Vec_IntCountEntry(vOutMap, 0) );
    Abc_Print( 1, "UNDEC = %6d. ",      Vec_IntCountEntry(vOutMap, -1) );
    Abc_Print( 1, "\n" );
    Abc_PrintTime( 1, "Command time", timeComm );
    Abc_PrintTime( 1, "Total time  ", Abc_Clock() - timeStart );
    // cleanup
    Vec_IntFree( vOuts );
    Gia_ManStop( p );
    return vOutMap;
}